

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

idx_t __thiscall duckdb::RowGroup::GetCommittedRowCount(RowGroup *this)

{
  idx_t iVar1;
  idx_t iVar2;
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  optional_ptr<duckdb::RowVersionManager,_true> local_20;
  
  local_20 = GetVersionInfo(this);
  iVar2 = (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i;
  if (local_20.ptr != (RowVersionManager *)0x0) {
    optional_ptr<duckdb::RowVersionManager,_true>::CheckValid(&local_20);
    iVar1 = RowVersionManager::GetCommittedDeletedCount
                      (local_20.ptr,
                       (this->super_SegmentBase<duckdb::RowGroup>).count.
                       super___atomic_base<unsigned_long>._M_i);
    iVar2 = iVar2 - iVar1;
  }
  return iVar2;
}

Assistant:

idx_t RowGroup::GetCommittedRowCount() {
	auto vinfo = GetVersionInfo();
	if (!vinfo) {
		return count;
	}
	return count - vinfo->GetCommittedDeletedCount(count);
}